

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chapter3.cpp
# Opt level: O2

shared_ptr<ApplicationContextBase>
CreateApplicationContext(GraphicsContext *gc,shared_ptr<UIContext> *ui)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<ApplicationContextBase> sVar2;
  GraphicsContext local_18;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_10;
  
  std::make_shared<ApplicationContext,GraphicsContext&,std::shared_ptr<UIContext>&>(&local_18,ui);
  _Var1._M_pi = _Stack_10._M_pi;
  _Stack_10._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  gc->_vptr_GraphicsContext = (_func_int **)local_18;
  gc[1]._vptr_GraphicsContext = (_func_int **)_Var1._M_pi;
  local_18._vptr_GraphicsContext = (_func_int **)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_10);
  sVar2.super___shared_ptr<ApplicationContextBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar2.super___shared_ptr<ApplicationContextBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)gc;
  return (shared_ptr<ApplicationContextBase>)
         sVar2.super___shared_ptr<ApplicationContextBase,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<ApplicationContextBase> CreateApplicationContext(GraphicsContext& gc, std::shared_ptr<UIContext> ui)
{
    return std::make_shared<ApplicationContext>(gc, ui);
}